

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_initCStream_internal
                 (ZSTDMT_CCtx *mtctx,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 unsigned_long_long pledgedSrcSize)

{
  ldmState_t *ldmState;
  U32 UVar1;
  U32 UVar2;
  void *pvVar3;
  ZSTD_freeFunction p_Var4;
  ZSTD_allocFunction p_Var5;
  BYTE *pBVar6;
  ZSTD_customMem customMem;
  ZSTD_customMem cMem;
  ZSTD_customMem cMem_00;
  ZSTD_customMem cMem_01;
  ZSTD_customMem customMem_00;
  ZSTD_customMem customMem_01;
  ZSTD_customMem customMem_02;
  ZSTD_customMem customMem_03;
  undefined1 auVar7 [12];
  undefined4 uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  U32 UVar12;
  size_t sVar13;
  ZSTD_CDict *pZVar14;
  ZSTDMT_jobDescription *pZVar15;
  ZSTDMT_bufferPool *pZVar16;
  ZSTDMT_CCtxPool *pZVar17;
  ulong uVar18;
  BYTE *pBVar19;
  ldmEntry_t *ptr;
  ldmEntry_t *plVar20;
  uint uVar21;
  size_t __size;
  size_t __size_00;
  int iVar22;
  U32 UVar23;
  ZSTD_format_e ZVar24;
  ulong uVar25;
  ulong uVar26;
  ZSTD_CCtx_params local_108;
  
  local_108.format = params.cParams.windowLog;
  local_108.cParams.windowLog = params.cParams.chainLog;
  local_108.cParams.chainLog = params.cParams.hashLog;
  local_108.cParams.hashLog = params.cParams.searchLog;
  local_108.cParams.searchLog = params.cParams.minMatch;
  local_108.cParams.minMatch = params.cParams.targetLength;
  local_108.cParams.targetLength = params.cParams.strategy;
  sVar13 = ZSTD_checkCParams(params.cParams);
  iVar22 = params.nbWorkers;
  if (0xffffffffffffff88 < sVar13) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x89b3,
                  "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                 );
  }
  if (cdict != (ZSTD_CDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x89b4,
                  "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                 );
  }
  if (params.nbWorkers == (mtctx->params).nbWorkers) {
LAB_001698d8:
    sVar13 = 0x80000;
    if ((params.jobSize - 1 < 0x7ffff) || (sVar13 = 0x40000000, 0x40000000 < params.jobSize)) {
      params.jobSize = sVar13;
    }
    sVar13 = params.jobSize;
    if (mtctx->allJobsCompleted == 0) {
      ZSTDMT_waitForAllJobsCompleted(mtctx);
      ZSTDMT_releaseAllJobResources(mtctx);
      mtctx->allJobsCompleted = 1;
    }
    memcpy(&mtctx->params,&params,0xd0);
    mtctx->frameContentSize = pledgedSrcSize;
    ZSTD_freeCDict(mtctx->cdictLocal);
    if (dict == (void *)0x0) {
      mtctx->cdictLocal = (ZSTD_CDict *)0x0;
      mtctx->cdict = cdict;
    }
    else {
      pvVar3 = (mtctx->cMem).opaque;
      p_Var4 = (mtctx->cMem).customFree;
      auVar7 = *(undefined1 (*) [12])&mtctx->cMem;
      memset(&local_108,0,0xd0);
      local_108.fParams.contentSizeFlag = 1;
      local_108.cParams.windowLog = params.cParams.windowLog;
      local_108.cParams.chainLog = params.cParams.chainLog;
      local_108.cParams.hashLog = params.cParams.hashLog;
      local_108.cParams.searchLog = params.cParams.searchLog;
      local_108.cParams.minMatch = params.cParams.minMatch;
      local_108.cParams.targetLength = params.cParams.targetLength;
      local_108.cParams.strategy = params.cParams.strategy;
      local_108.customMem.customAlloc = (mtctx->cMem).customAlloc;
      local_108.customMem.customFree = (mtctx->cMem).customFree;
      local_108.customMem.opaque = (mtctx->cMem).opaque;
      customMem.customFree._4_4_ = (int)((ulong)p_Var4 >> 0x20);
      customMem._0_12_ = auVar7;
      customMem.opaque._0_4_ = (int)pvVar3;
      customMem.opaque._4_4_ = (int)((ulong)pvVar3 >> 0x20);
      pZVar14 = ZSTD_createCDict_advanced2
                          (dict,dictSize,ZSTD_dlm_byCopy,dictContentType,&local_108,customMem);
      mtctx->cdictLocal = pZVar14;
      mtctx->cdict = pZVar14;
      if (pZVar14 == (ZSTD_CDict *)0x0) goto LAB_00169a1e;
    }
    uVar11 = params.cParams.windowLog;
    if (9 < (uint)params.overlapLog) {
      __assert_fail("0 <= ovlog && ovlog <= 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x898d,"int ZSTDMT_overlapLog(int, ZSTD_strategy)");
    }
    if (params.overlapLog == 0) {
      if (params.cParams.strategy - ZSTD_lazy2 < 5) {
        iVar22 = *(int *)(&DAT_0025e300 + (ulong)(params.cParams.strategy - ZSTD_lazy2) * 4);
      }
      else {
        iVar22 = 3;
      }
LAB_00169bbd:
      uVar21 = params.cParams.windowLog - iVar22;
    }
    else {
      if (params.overlapLog != 1) {
        iVar22 = 9 - params.overlapLog;
        goto LAB_00169bbd;
      }
      uVar21 = 0;
      iVar22 = 8;
    }
    if (params.ldmParams.enableLdm == ZSTD_ps_enable) {
      uVar10 = ZSTDMT_computeTargetJobLog(&params);
      uVar21 = uVar10 - 2;
      if (uVar11 < uVar10 - 2) {
        uVar21 = uVar11;
      }
      uVar21 = uVar21 - iVar22;
    }
    if (0x1f < uVar21) {
      __assert_fail("0 <= ovLog && ovLog <= ZSTD_WINDOWLOG_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x899f,"size_t ZSTDMT_computeOverlapSize(const ZSTD_CCtx_params *)");
    }
    uVar25 = 1L << ((byte)uVar21 & 0x3f);
    uVar18 = 0;
    if (uVar21 != 0) {
      uVar18 = uVar25;
    }
    mtctx->targetPrefixSize = uVar18;
    mtctx->targetSectionSize = sVar13;
    if (sVar13 == 0) {
      uVar11 = ZSTDMT_computeTargetJobLog(&params);
      sVar13 = 1L << ((byte)uVar11 & 0x3f);
      mtctx->targetSectionSize = sVar13;
    }
    if (params.rsyncable != 0) {
      uVar11 = (uint)(sVar13 >> 10);
      if (uVar11 == 0) {
        __assert_fail("jobSizeKB >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x89df,
                      "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                     );
      }
      uVar21 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar21 == 0; uVar21 = uVar21 - 1) {
        }
      }
      if (uVar21 < 9) {
        __assert_fail("rsyncBits >= RSYNC_MIN_BLOCK_LOG + 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x89e2,
                      "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                     );
      }
      (mtctx->rsync).hash = 0;
      (mtctx->rsync).hitMask = ~(-1L << (0x29 - ((byte)uVar21 ^ 0x1f) & 0x3f));
      (mtctx->rsync).primePower = 0xf5507fe35f91f8cb;
    }
    if (sVar13 < uVar18) {
      mtctx->targetSectionSize = uVar18;
      sVar13 = uVar25;
    }
    pZVar16 = mtctx->bufPool;
    sVar13 = ZSTD_compressBound(sVar13);
    ZSTDMT_setBufferSize(pZVar16,sVar13);
    if ((mtctx->params).ldmParams.enableLdm == ZSTD_ps_enable) {
      uVar18 = 1L << ((byte)(mtctx->params).cParams.windowLog & 0x3f);
    }
    else {
      uVar18 = 0;
    }
    sVar13 = mtctx->targetSectionSize;
    uVar11 = (mtctx->params).nbWorkers;
    uVar25 = 1;
    if (1 < (int)uVar11) {
      uVar25 = (ulong)uVar11;
    }
    uVar26 = uVar25 * sVar13;
    if (uVar25 * sVar13 < uVar18) {
      uVar26 = uVar18;
    }
    uVar26 = uVar26 + (3 - (ulong)(mtctx->targetPrefixSize == 0)) * sVar13;
    if ((mtctx->roundBuff).capacity < uVar26) {
      pBVar19 = (mtctx->roundBuff).buffer;
      if (pBVar19 != (BYTE *)0x0) {
        pvVar3 = (mtctx->cMem).opaque;
        customMem_00.customFree._4_4_ = (int)((ulong)(mtctx->cMem).customFree >> 0x20);
        customMem_00._0_12_ = *(undefined1 (*) [12])&mtctx->cMem;
        customMem_00.opaque._0_4_ = (int)pvVar3;
        customMem_00.opaque._4_4_ = (int)((ulong)pvVar3 >> 0x20);
        ZSTD_customFree(pBVar19,customMem_00);
      }
      pvVar3 = (mtctx->cMem).opaque;
      customMem_01.customFree._4_4_ = (int)((ulong)(mtctx->cMem).customFree >> 0x20);
      customMem_01._0_12_ = *(undefined1 (*) [12])&mtctx->cMem;
      customMem_01.opaque._0_4_ = (int)pvVar3;
      customMem_01.opaque._4_4_ = (int)((ulong)pvVar3 >> 0x20);
      pBVar19 = (BYTE *)ZSTD_customMalloc(uVar26,customMem_01);
      (mtctx->roundBuff).buffer = pBVar19;
      if (pBVar19 == (BYTE *)0x0) {
        (mtctx->roundBuff).capacity = 0;
        goto LAB_00169a1e;
      }
      (mtctx->roundBuff).capacity = uVar26;
      sVar13 = mtctx->targetSectionSize;
    }
    (mtctx->roundBuff).pos = 0;
    mtctx->doneJobID = 0;
    mtctx->nextJobID = 0;
    mtctx->frameEnded = 0;
    mtctx->allJobsCompleted = 0;
    mtctx->consumed = 0;
    mtctx->produced = 0;
    (mtctx->inBuff).prefix.start = (void *)0x0;
    (mtctx->inBuff).prefix.size = 0;
    (mtctx->inBuff).buffer.start = (void *)0x0;
    (mtctx->inBuff).buffer.capacity = 0;
    (mtctx->inBuff).filled = 0;
    pZVar16 = mtctx->seqPool;
    memcpy(&local_108,&params,0xd0);
    if (local_108.ldmParams.enableLdm == ZSTD_ps_enable) {
      ZSTD_ldm_adjustParameters(&local_108.ldmParams,&local_108.cParams);
      if (local_108.ldmParams.hashLog < local_108.ldmParams.bucketSizeLog) {
        __assert_fail("params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x86c9,
                      "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t, ZSTD_dictContentType_e)"
                     );
      }
      UVar23 = local_108.ldmParams.hashLog;
      UVar12 = local_108.ldmParams.bucketSizeLog;
      if (0x1f < local_108.ldmParams.hashRateLog) {
        __assert_fail("params.ldmParams.hashRateLog < 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x86ca,
                      "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t, ZSTD_dictContentType_e)"
                     );
      }
    }
    else {
      local_108.ldmParams.hashRateLog = 0;
      local_108.ldmParams.windowLog = 0;
      local_108.ldmParams.enableLdm = ZSTD_ps_auto;
      local_108.ldmParams.hashLog = 0;
      local_108.ldmParams.bucketSizeLog = 0;
      local_108.ldmParams.minMatchLength = 0;
      UVar12 = 0;
      UVar23 = 0;
    }
    pvVar3 = local_108.customMem.opaque;
    p_Var5 = local_108.customMem.customAlloc;
    (mtctx->serial).nextJobID = 0;
    if (local_108.fParams.checksumFlag != 0) {
      (mtctx->serial).xxhState.total_len = 0;
      (mtctx->serial).xxhState.v[0] = 0;
      (mtctx->serial).xxhState.v[1] = 0;
      (mtctx->serial).xxhState.v[2] = 0;
      (mtctx->serial).xxhState.v[3] = 0;
      (mtctx->serial).xxhState.mem64[0] = 0;
      (mtctx->serial).xxhState.reserved64 = 0;
      (mtctx->serial).xxhState.mem64[3] = 0;
      (mtctx->serial).xxhState.memsize = 0;
      (mtctx->serial).xxhState.reserved32 = 0;
      (mtctx->serial).xxhState.mem64[1] = 0;
      (mtctx->serial).xxhState.mem64[2] = 0;
      (mtctx->serial).xxhState.v[0] = 0x60ea27eeadc0b5d6;
      (mtctx->serial).xxhState.v[1] = 0xc2b2ae3d27d4eb4f;
      (mtctx->serial).xxhState.v[3] = 0x61c8864e7a143579;
    }
    if (local_108.ldmParams.enableLdm == ZSTD_ps_enable) {
      __size = 8L << ((byte)UVar23 & 0x3f);
      UVar1 = (mtctx->serial).params.ldmParams.hashLog;
      __size_00 = 1L << ((byte)(UVar23 - UVar12) & 0x3f);
      UVar2 = (mtctx->serial).params.ldmParams.bucketSizeLog;
      ZSTDMT_setBufferSize(pZVar16,(sVar13 / ((ulong)local_108.ldmParams._8_8_ >> 0x20)) * 0xc);
      *(undefined8 *)&(mtctx->serial).ldmState.window.nbOverflowCorrections = 0;
      (mtctx->serial).ldmState.window.base = " ";
      (mtctx->serial).ldmState.window.dictBase = " ";
      (mtctx->serial).ldmState.window.dictLimit = 2;
      (mtctx->serial).ldmState.window.lowLimit = 2;
      (mtctx->serial).ldmState.window.nextSrc = (BYTE *)"\r%79s\r";
      ptr = (mtctx->serial).ldmState.hashTable;
      if ((ptr == (ldmEntry_t *)0x0) || ((mtctx->serial).params.ldmParams.hashLog < UVar23)) {
        customMem_02.customFree._0_4_ = (int)local_108.customMem.customFree;
        customMem_02.customAlloc = local_108.customMem.customAlloc;
        customMem_02.customFree._4_4_ = (int)((ulong)local_108.customMem.customFree >> 0x20);
        customMem_02.opaque._0_4_ = (int)local_108.customMem.opaque;
        customMem_02.opaque._4_4_ = (int)((ulong)local_108.customMem.opaque >> 0x20);
        ZSTD_customFree(ptr,customMem_02);
        if (p_Var5 == (ZSTD_allocFunction)0x0) {
          ptr = (ldmEntry_t *)malloc(__size);
        }
        else {
          ptr = (ldmEntry_t *)(*p_Var5)(pvVar3,__size);
        }
        (mtctx->serial).ldmState.hashTable = ptr;
      }
      pBVar19 = (mtctx->serial).ldmState.bucketOffsets;
      if ((pBVar19 == (BYTE *)0x0) || (plVar20 = ptr, UVar1 - UVar2 < UVar23 - UVar12)) {
        customMem_03.customFree._0_4_ = (int)local_108.customMem.customFree;
        customMem_03.customAlloc = local_108.customMem.customAlloc;
        customMem_03.customFree._4_4_ = (int)((ulong)local_108.customMem.customFree >> 0x20);
        customMem_03.opaque._0_4_ = (int)local_108.customMem.opaque;
        customMem_03.opaque._4_4_ = (int)((ulong)local_108.customMem.opaque >> 0x20);
        ZSTD_customFree(pBVar19,customMem_03);
        if (p_Var5 == (ZSTD_allocFunction)0x0) {
          plVar20 = (ldmEntry_t *)malloc(__size_00);
        }
        else {
          plVar20 = (ldmEntry_t *)(*p_Var5)(pvVar3,__size_00);
        }
        (mtctx->serial).ldmState.bucketOffsets = (BYTE *)plVar20;
        ptr = (mtctx->serial).ldmState.hashTable;
        if (ptr == (ldmEntry_t *)0x0) goto LAB_00169a1e;
      }
      if (plVar20 == (ldmEntry_t *)0x0) goto LAB_00169a1e;
      ldmState = &(mtctx->serial).ldmState;
      UVar23 = 0;
      memset(ptr,0,__size);
      memset((mtctx->serial).ldmState.bucketOffsets,0,__size_00);
      (mtctx->serial).ldmState.loadedDictEnd = 0;
      if (dictContentType == ZSTD_dct_rawContent && dictSize != 0) {
        ZSTD_window_update(&ldmState->window,dict,dictSize,0);
        ZSTD_ldm_fillHashTable
                  (ldmState,(BYTE *)dict,(BYTE *)(dictSize + (long)dict),&local_108.ldmParams);
        if (local_108.forceWindow == 0) {
          UVar23 = (int)(BYTE *)(dictSize + (long)dict) -
                   *(int *)&(mtctx->serial).ldmState.window.base;
        }
        (mtctx->serial).ldmState.loadedDictEnd = UVar23;
      }
      uVar8 = *(undefined4 *)&(mtctx->serial).ldmState.window.field_0x24;
      (mtctx->serial).ldmWindow.nbOverflowCorrections =
           (mtctx->serial).ldmState.window.nbOverflowCorrections;
      *(undefined4 *)&(mtctx->serial).ldmWindow.field_0x24 = uVar8;
      pBVar19 = (ldmState->window).nextSrc;
      pBVar6 = (mtctx->serial).ldmState.window.base;
      UVar23 = (mtctx->serial).ldmState.window.dictLimit;
      UVar12 = (mtctx->serial).ldmState.window.lowLimit;
      (mtctx->serial).ldmWindow.dictBase = (mtctx->serial).ldmState.window.dictBase;
      (mtctx->serial).ldmWindow.dictLimit = UVar23;
      (mtctx->serial).ldmWindow.lowLimit = UVar12;
      (mtctx->serial).ldmWindow.nextSrc = pBVar19;
      (mtctx->serial).ldmWindow.base = pBVar6;
    }
    memcpy(&(mtctx->serial).params,&local_108,0xd0);
    (mtctx->serial).params.jobSize = sVar13 & 0xffffffff;
    sVar13 = 0;
  }
  else {
    iVar9 = POOL_resize(mtctx->factory,(ulong)(uint)params.nbWorkers);
    if (iVar9 == 0) {
      local_108.format = iVar22 + 2;
      ZVar24 = mtctx->jobIDMask + ZSTD_f_zstd1_magicless;
      if (ZVar24 < local_108.format) {
        pvVar3 = (mtctx->cMem).opaque;
        cMem.customFree._4_4_ = (int)((ulong)(mtctx->cMem).customFree >> 0x20);
        cMem._0_12_ = *(undefined1 (*) [12])&mtctx->cMem;
        cMem.opaque._0_4_ = (int)pvVar3;
        cMem.opaque._4_4_ = (int)((ulong)pvVar3 >> 0x20);
        ZSTDMT_freeJobsTable(mtctx->jobs,ZVar24,cMem);
        mtctx->jobIDMask = 0;
        pvVar3 = (mtctx->cMem).opaque;
        cMem_00.customFree._4_4_ = (int)((ulong)(mtctx->cMem).customFree >> 0x20);
        cMem_00._0_12_ = *(undefined1 (*) [12])&mtctx->cMem;
        cMem_00.opaque._0_4_ = (int)pvVar3;
        cMem_00.opaque._4_4_ = (int)((ulong)pvVar3 >> 0x20);
        pZVar15 = ZSTDMT_createJobsTable(&local_108.format,cMem_00);
        mtctx->jobs = pZVar15;
        if (pZVar15 == (ZSTDMT_jobDescription *)0x0) goto LAB_00169a1e;
        ZVar24 = local_108.format - ZSTD_f_zstd1_magicless;
        if ((local_108.format ^ ZVar24) <= ZVar24) {
          __assert_fail("(nbJobs != 0) && ((nbJobs & (nbJobs - 1)) == 0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8870,"size_t ZSTDMT_expandJobsTable(ZSTDMT_CCtx *, U32)");
        }
        mtctx->jobIDMask = ZVar24;
      }
      pZVar16 = ZSTDMT_expandBufferPool(mtctx->bufPool,iVar22 * 2 + 3);
      mtctx->bufPool = pZVar16;
      if ((pZVar16 != (ZSTDMT_bufferPool *)0x0) &&
         (pZVar17 = mtctx->cctxPool, pZVar17 != (ZSTDMT_CCtxPool *)0x0)) {
        if (pZVar17->totalCCtx < iVar22) {
          pvVar3 = (pZVar17->cMem).opaque;
          local_108.cParams.searchLog = (uint)pvVar3;
          local_108.cParams.minMatch = (uint)((ulong)pvVar3 >> 0x20);
          p_Var5 = (pZVar17->cMem).customAlloc;
          p_Var4 = (pZVar17->cMem).customFree;
          local_108.format = (ZSTD_format_e)p_Var5;
          local_108.cParams.windowLog = (uint)((ulong)p_Var5 >> 0x20);
          local_108.cParams.chainLog = (uint)p_Var4;
          local_108.cParams.hashLog = (uint)((ulong)p_Var4 >> 0x20);
          ZSTDMT_freeCCtxPool(pZVar17);
          cMem_01.customAlloc._4_4_ = local_108.cParams.windowLog;
          cMem_01.customAlloc._0_4_ = local_108.format;
          cMem_01.customFree._0_4_ = local_108.cParams.chainLog;
          cMem_01.customFree._4_4_ = local_108.cParams.hashLog;
          cMem_01.opaque._0_4_ = local_108.cParams.searchLog;
          cMem_01.opaque._4_4_ = local_108.cParams.minMatch;
          pZVar17 = ZSTDMT_createCCtxPool(iVar22,cMem_01);
          mtctx->cctxPool = pZVar17;
          if (pZVar17 == (ZSTDMT_CCtxPool *)0x0) goto LAB_00169a1e;
        }
        pZVar16 = ZSTDMT_expandBufferPool(mtctx->seqPool,iVar22);
        mtctx->seqPool = pZVar16;
        if (pZVar16 != (ZSTDMT_bufferPool *)0x0) {
          ZSTDMT_CCtxParam_setNbWorkers(&mtctx->params,iVar22);
          goto LAB_001698d8;
        }
      }
    }
LAB_00169a1e:
    sVar13 = 0xffffffffffffffc0;
  }
  return sVar13;
}

Assistant:

size_t ZSTDMT_initCStream_internal(
        ZSTDMT_CCtx* mtctx,
        const void* dict, size_t dictSize, ZSTD_dictContentType_e dictContentType,
        const ZSTD_CDict* cdict, ZSTD_CCtx_params params,
        unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTDMT_initCStream_internal (pledgedSrcSize=%u, nbWorkers=%u, cctxPool=%u)",
                (U32)pledgedSrcSize, params.nbWorkers, mtctx->cctxPool->totalCCtx);

    /* params supposed partially fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    /* init */
    if (params.nbWorkers != mtctx->params.nbWorkers)
        FORWARD_IF_ERROR( ZSTDMT_resize(mtctx, params.nbWorkers) , "");

    if (params.jobSize != 0 && params.jobSize < ZSTDMT_JOBSIZE_MIN) params.jobSize = ZSTDMT_JOBSIZE_MIN;
    if (params.jobSize > (size_t)ZSTDMT_JOBSIZE_MAX) params.jobSize = (size_t)ZSTDMT_JOBSIZE_MAX;

    DEBUGLOG(4, "ZSTDMT_initCStream_internal: %u workers", params.nbWorkers);

    if (mtctx->allJobsCompleted == 0) {   /* previous compression not correctly finished */
        ZSTDMT_waitForAllJobsCompleted(mtctx);
        ZSTDMT_releaseAllJobResources(mtctx);
        mtctx->allJobsCompleted = 1;
    }

    mtctx->params = params;
    mtctx->frameContentSize = pledgedSrcSize;
    if (dict) {
        ZSTD_freeCDict(mtctx->cdictLocal);
        mtctx->cdictLocal = ZSTD_createCDict_advanced(dict, dictSize,
                                                    ZSTD_dlm_byCopy, dictContentType, /* note : a loadPrefix becomes an internal CDict */
                                                    params.cParams, mtctx->cMem);
        mtctx->cdict = mtctx->cdictLocal;
        if (mtctx->cdictLocal == NULL) return ERROR(memory_allocation);
    } else {
        ZSTD_freeCDict(mtctx->cdictLocal);
        mtctx->cdictLocal = NULL;
        mtctx->cdict = cdict;
    }

    mtctx->targetPrefixSize = ZSTDMT_computeOverlapSize(&params);
    DEBUGLOG(4, "overlapLog=%i => %u KB", params.overlapLog, (U32)(mtctx->targetPrefixSize>>10));
    mtctx->targetSectionSize = params.jobSize;
    if (mtctx->targetSectionSize == 0) {
        mtctx->targetSectionSize = 1ULL << ZSTDMT_computeTargetJobLog(&params);
    }
    assert(mtctx->targetSectionSize <= (size_t)ZSTDMT_JOBSIZE_MAX);

    if (params.rsyncable) {
        /* Aim for the targetsectionSize as the average job size. */
        U32 const jobSizeKB = (U32)(mtctx->targetSectionSize >> 10);
        U32 const rsyncBits = (assert(jobSizeKB >= 1), ZSTD_highbit32(jobSizeKB) + 10);
        /* We refuse to create jobs < RSYNC_MIN_BLOCK_SIZE bytes, so make sure our
         * expected job size is at least 4x larger. */
        assert(rsyncBits >= RSYNC_MIN_BLOCK_LOG + 2);
        DEBUGLOG(4, "rsyncLog = %u", rsyncBits);
        mtctx->rsync.hash = 0;
        mtctx->rsync.hitMask = (1ULL << rsyncBits) - 1;
        mtctx->rsync.primePower = ZSTD_rollingHash_primePower(RSYNC_LENGTH);
    }
    if (mtctx->targetSectionSize < mtctx->targetPrefixSize) mtctx->targetSectionSize = mtctx->targetPrefixSize;  /* job size must be >= overlap size */
    DEBUGLOG(4, "Job Size : %u KB (note : set to %u)", (U32)(mtctx->targetSectionSize>>10), (U32)params.jobSize);
    DEBUGLOG(4, "inBuff Size : %u KB", (U32)(mtctx->targetSectionSize>>10));
    ZSTDMT_setBufferSize(mtctx->bufPool, ZSTD_compressBound(mtctx->targetSectionSize));
    {
        /* If ldm is enabled we need windowSize space. */
        size_t const windowSize = mtctx->params.ldmParams.enableLdm == ZSTD_ps_enable ? (1U << mtctx->params.cParams.windowLog) : 0;
        /* Two buffers of slack, plus extra space for the overlap
         * This is the minimum slack that LDM works with. One extra because
         * flush might waste up to targetSectionSize-1 bytes. Another extra
         * for the overlap (if > 0), then one to fill which doesn't overlap
         * with the LDM window.
         */
        size_t const nbSlackBuffers = 2 + (mtctx->targetPrefixSize > 0);
        size_t const slackSize = mtctx->targetSectionSize * nbSlackBuffers;
        /* Compute the total size, and always have enough slack */
        size_t const nbWorkers = MAX(mtctx->params.nbWorkers, 1);
        size_t const sectionsSize = mtctx->targetSectionSize * nbWorkers;
        size_t const capacity = MAX(windowSize, sectionsSize) + slackSize;
        if (mtctx->roundBuff.capacity < capacity) {
            if (mtctx->roundBuff.buffer)
                ZSTD_customFree(mtctx->roundBuff.buffer, mtctx->cMem);
            mtctx->roundBuff.buffer = (BYTE*)ZSTD_customMalloc(capacity, mtctx->cMem);
            if (mtctx->roundBuff.buffer == NULL) {
                mtctx->roundBuff.capacity = 0;
                return ERROR(memory_allocation);
            }
            mtctx->roundBuff.capacity = capacity;
        }
    }
    DEBUGLOG(4, "roundBuff capacity : %u KB", (U32)(mtctx->roundBuff.capacity>>10));
    mtctx->roundBuff.pos = 0;
    mtctx->inBuff.buffer = g_nullBuffer;
    mtctx->inBuff.filled = 0;
    mtctx->inBuff.prefix = kNullRange;
    mtctx->doneJobID = 0;
    mtctx->nextJobID = 0;
    mtctx->frameEnded = 0;
    mtctx->allJobsCompleted = 0;
    mtctx->consumed = 0;
    mtctx->produced = 0;
    if (ZSTDMT_serialState_reset(&mtctx->serial, mtctx->seqPool, params, mtctx->targetSectionSize,
                                 dict, dictSize, dictContentType))
        return ERROR(memory_allocation);
    return 0;
}